

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.cpp
# Opt level: O0

void __thiscall CEffects::HammerHit(CEffects *this,vec2 Pos)

{
  vec2 in_RDI;
  long in_FS_OFFSET;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_XMM0_Da;
  float fVar1;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_XMM0_Db;
  CParticle p;
  float in_stack_ffffffffffffff7c;
  CParticle *this_00;
  vec2 Pos_00;
  CParticle local_60;
  vec2 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.field_1 = in_XMM0_Db;
  local_10.field_0 = in_XMM0_Da;
  this_00 = &local_60;
  Pos_00 = in_RDI;
  CParticle::CParticle(this_00);
  CParticle::SetDefault(this_00);
  local_60.m_Spr = 9;
  local_60.m_Pos = local_10;
  local_60.m_LifeSpan = 0.3;
  local_60.m_StartSize = 120.0;
  local_60.m_EndSize = 0.0;
  fVar1 = random_float();
  local_60.m_Rot = fVar1 * 3.1415927 + fVar1 * 3.1415927;
  CParticles::Add((CParticles *)Pos_00,(int)in_RDI.field_1,this_00);
  CSounds::PlayAt((CSounds *)in_RDI,(int)((ulong)this_00 >> 0x20),(int)this_00,
                  in_stack_ffffffffffffff7c,Pos_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEffects::HammerHit(vec2 Pos)
{
	// add the explosion
	CParticle p;
	p.SetDefault();
	p.m_Spr = SPRITE_PART_HIT01;
	p.m_Pos = Pos;
	p.m_LifeSpan = 0.3f;
	p.m_StartSize = 120.0f;
	p.m_EndSize = 0;
	p.m_Rot = random_float()*pi*2;
	m_pClient->m_pParticles->Add(CParticles::GROUP_EXPLOSIONS, &p);
	m_pClient->m_pSounds->PlayAt(CSounds::CHN_WORLD, SOUND_HAMMER_HIT, 1.0f, Pos);
}